

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

QueryId __thiscall
helics::Federate::queryAsync(Federate *this,string_view queryStr,HelicsSequencingModes mode)

{
  element_type *peVar1;
  undefined4 uVar2;
  Federate *pFVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00
  ;
  InvalidFunctionCall *this_01;
  undefined4 in_register_0000000c;
  _State_baseV2 *__tmp;
  size_t sVar5;
  undefined4 in_R8D;
  string_view message;
  int cnt;
  handle asyncInfo;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> queryFut;
  _func_int **local_80 [2];
  long *local_70;
  undefined1 local_68 [16];
  undefined1 local_58;
  Federate *local_48;
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  sVar5 = queryStr._M_len;
  local_48 = this;
  if (*(char *)(sVar5 + 0xe) == '\x01') {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "No Async calls are allowed in single thread federates";
    message._M_len = 0x35;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message);
    __cxa_throw(this_01,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  local_68._0_8_ = (element_type *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00515aa8;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var4[2]._M_use_count = 0;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[3]._M_use_count = 0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00515af8;
  this_00 = (_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x38);
  std::__future_base::
  _Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::_Result
            (this_00);
  p_Var4[4]._vptr__Sp_counted_base = (_func_int **)this_00;
  p_Var4[4]._M_use_count = (int)sVar5;
  p_Var4[4]._M_weak_count = (int)(sVar5 >> 0x20);
  p_Var4[5]._vptr__Sp_counted_base = (_func_int **)queryStr._M_str;
  p_Var4[5]._M_use_count = mode;
  p_Var4[5]._M_weak_count = in_register_0000000c;
  *(undefined4 *)&p_Var4[6]._vptr__Sp_counted_base = in_R8D;
  local_80[0] = (_func_int **)0x0;
  local_70 = (long *)operator_new(0x20);
  *local_70 = (long)&PTR___State_00515b50;
  local_70[1] = (long)(p_Var4 + 1);
  local_70[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1874:40)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_M_run;
  local_70[3] = 0;
  std::thread::_M_start_thread(local_80,&local_70,0);
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 8))();
  }
  if (p_Var4[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var4[3]._vptr__Sp_counted_base = local_80[0];
    local_68._0_8_ = (element_type *)(p_Var4 + 1);
    local_68._8_8_ = p_Var4;
    std::
    __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::__basic_future(&local_40,(__state_type *)local_68);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    local_68._0_8_ = *(long *)(sVar5 + 0x58);
    local_68._8_8_ = &((element_type *)(local_68._0_8_ + 0xa0))->_M_once;
    local_58 = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_68 + 8));
    local_58 = 1;
    LOCK();
    peVar1 = (element_type *)(local_68._0_8_ + 0x60);
    uVar2 = *(undefined4 *)&peVar1->_vptr__State_baseV2;
    *(int *)&peVar1->_vptr__State_baseV2 = *(int *)&peVar1->_vptr__State_baseV2 + 1;
    UNLOCK();
    local_80[0] = (_func_int **)CONCAT44(local_80[0]._4_4_,uVar2);
    std::
    _Rb_tree<int,std::pair<int_const,std::future<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::future<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::future<std::__cxx11::string>>>>
    ::_M_emplace_unique<int&,std::future<std::__cxx11::string>>
              ((_Rb_tree<int,std::pair<int_const,std::future<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::future<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::future<std::__cxx11::string>>>>
                *)&((element_type *)(local_68._0_8_ + 0x60))->_M_result,(int *)local_80,
               (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_40);
    pFVar3 = local_48;
    *(undefined4 *)&local_48->_vptr_Federate = local_80[0]._0_4_;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_68 + 8));
    if (local_40._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (QueryId)(uint)pFVar3;
  }
  std::terminate();
}

Assistant:

QueryId Federate::queryAsync(std::string_view queryStr, HelicsSequencingModes mode)
{
    if (singleThreadFederate) {
        throw(helics::InvalidFunctionCall("No Async calls are allowed in single thread federates"));
    }
    auto queryFut =
        std::async(std::launch::async, [this, queryStr, mode]() { return query(queryStr, mode); });
    auto asyncInfo = asyncCallInfo->lock();
    int cnt = asyncInfo->queryCounter++;

    asyncInfo->inFlightQueries.emplace(cnt, std::move(queryFut));
    return QueryId(cnt);
}